

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBTensorOp.cpp
# Opt level: O1

void __thiscall
amrex::MLEBTensorOp::compCrossTerms(MLEBTensorOp *this,int amrlev,int mglev,MultiFab *mf)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  FabType FVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  int *piVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  int iVar38;
  long lVar39;
  int iVar40;
  int iVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  uint uVar47;
  Geometry *this_00;
  FabArray<amrex::FArrayBox> *pFVar48;
  void *pvVar49;
  int iVar50;
  long lVar51;
  uint uVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  bool bVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  Box zbx;
  Box ybx;
  Box xbx;
  Array4<const_double> vfab;
  Box result;
  Array4<double> fzfab;
  Array4<double> fyfab;
  Array4<const_double> etazfab;
  Array4<const_double> etayfab;
  Array4<const_double> etaxfab;
  Array4<const_double> kapzfab;
  Array4<const_double> kapyfab;
  Array4<const_double> kapxfab;
  MFIter mfi;
  MFItInfo mfi_info;
  int local_6a8;
  long local_6a0;
  long local_690;
  long local_680;
  long local_648;
  long local_638;
  long local_630;
  long local_628;
  Box local_554;
  Box local_538;
  Box local_51c;
  Array4<const_double> local_500;
  FabArray<amrex::EBCellFlagFab> *local_4c0;
  double local_4b8;
  double local_4b0;
  double local_4a8;
  int local_49c;
  undefined1 local_498 [28];
  undefined4 uStack_47c;
  int local_478;
  int local_474;
  int local_470;
  FabArray<amrex::FArrayBox> *local_450;
  FabArray<amrex::FArrayBox> *local_448;
  FabArray<amrex::FArrayBox> *local_440;
  FabArray<amrex::FArrayBox> *local_438;
  FabArray<amrex::FArrayBox> *local_430;
  Array4<double> local_428;
  Array4<double> local_3e8;
  Array4<const_amrex::EBCellFlag> local_3a8;
  MultiCutFab *local_368;
  MultiCutFab *pMStack_360;
  MultiCutFab *local_358;
  long local_350;
  double local_348;
  double local_340;
  double local_338;
  FabArray<amrex::FArrayBox> *local_330;
  FabArray<amrex::FArrayBox> *local_328;
  FabArray<amrex::FArrayBox> *local_320;
  FabArray<amrex::FArrayBox> *local_318;
  FabArray<amrex::FArrayBox> *local_310;
  long local_308;
  Array4<const_double> local_300;
  Array4<const_double> local_2c0;
  Array4<const_double> local_280;
  Array4<const_double> local_240;
  Array4<const_double> local_200;
  Array4<const_double> local_1c0;
  IntVect local_180;
  int local_160 [2];
  int local_158;
  Vector<int,_std::allocator<int>_> *local_140;
  Array4<const_double> local_120;
  Array4<const_double> local_e0;
  Array4<const_double> local_a0;
  Box local_60;
  MFItInfo local_44;
  
  lVar53 = (long)mglev;
  lVar13 = *(long *)(*(long *)&(this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.
                               super_MLLinOp.m_factory.
                               super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[amrlev].
                               super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                               .
                               super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                    + lVar53 * 8);
  local_440 = &mf->super_FabArray<amrex::FArrayBox>;
  if (lVar13 == 0) {
    lVar13 = 0;
  }
  else {
    lVar13 = __dynamic_cast(lVar13,&FabFactory<amrex::FArrayBox>::typeinfo,
                            &EBFArrayBoxFactory::typeinfo,0);
  }
  if (lVar13 == 0) {
    local_4c0 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    local_368 = (MultiCutFab *)0x0;
    pMStack_360 = (MultiCutFab *)0x0;
    local_358 = (MultiCutFab *)0x0;
  }
  else {
    local_4c0 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar13 + 0xd8));
    EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar13 + 0xd8));
  }
  lVar13 = *(long *)&(this->super_MLEBABecLap).super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.
                     m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  local_350 = lVar53 * 200;
  local_4a8 = *(double *)(lVar13 + 0x38 + local_350);
  local_4b0 = *(double *)(lVar13 + 0x40 + local_350);
  local_4b8 = *(double *)(lVar13 + 0x48 + local_350);
  lVar53 = lVar53 * 0x480;
  local_448 = (FabArray<amrex::FArrayBox> *)
              (*(long *)&(this->super_MLEBABecLap).m_b_coeffs.
                         super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[amrlev].
                         super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                         .
                         super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              + lVar53);
  local_450 = (FabArray<amrex::FArrayBox> *)
              (*(long *)&(this->m_kappa).
                         super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[amrlev].
                         super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                         .
                         super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              + lVar53);
  pFVar48 = (FabArray<amrex::FArrayBox> *)
            (lVar53 + *(long *)&(this->m_tauflux).
                                super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                                .
                                super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                                .
                                super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
            );
  local_44.num_streams = Gpu::Device::max_gpu_streams;
  local_44.do_tiling = true;
  local_44.dynamic = true;
  local_44.device_sync = true;
  local_44.tilesize.vect[2] = DAT_00753ec0;
  local_44.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_44.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  MFIter::MFIter((MFIter *)&local_180,&local_440->super_FabArrayBase,&local_44);
  if (local_160[0] < local_158) {
    local_430 = pFVar48 + 1;
    local_438 = pFVar48 + 2;
    local_328 = local_448 + 1;
    local_330 = local_448 + 2;
    local_318 = local_450 + 1;
    local_320 = local_450 + 2;
    local_338 = local_4b0 * 0.5;
    local_340 = local_4b8 * 0.5;
    local_348 = local_4a8 * 0.5;
    local_4b0 = local_4b0 * 0.25;
    local_4b8 = local_4b8 * 0.25;
    local_4a8 = local_4a8 * 0.25;
    local_310 = pFVar48;
    local_308 = lVar13;
    do {
      pFVar48 = local_310;
      MFIter::tilebox(&local_60,(MFIter *)&local_180);
      MFIter::nodaltilebox(&local_51c,(MFIter *)&local_180,0);
      MFIter::nodaltilebox(&local_538,(MFIter *)&local_180,1);
      MFIter::nodaltilebox(&local_554,(MFIter *)&local_180,2);
      FVar9 = regular;
      if (local_4c0 != (FabArray<amrex::EBCellFlagFab> *)0x0) {
        piVar14 = local_160;
        if (local_140 != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar14 = (local_140->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_160[0];
        }
        local_498._20_4_ = local_60.bigend.vect[2];
        local_498._24_4_ = local_60.btype.itype;
        local_498._0_4_ = local_60.smallend.vect[0];
        local_498._4_4_ = local_60.smallend.vect[1];
        local_498._8_4_ = local_60.smallend.vect[2] + -1;
        local_498._12_4_ = local_60.bigend.vect[0] + 1;
        local_498._4_4_ = local_498._4_4_ + -1;
        local_498._0_4_ = local_498._0_4_ + -1;
        local_498._16_4_ = local_60.bigend.vect[1] + 1;
        local_498._20_4_ = local_498._20_4_ + 1;
        FVar9 = EBCellFlagFab::getType
                          ((local_4c0->m_fabs_v).
                           super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[*piVar14],(Box *)local_498);
      }
      if (FVar9 == covered) {
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)local_498,pFVar48,(MFIter *)&local_180);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_3e8,local_430,(MFIter *)&local_180);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_428,local_438,(MFIter *)&local_180);
        iVar38 = local_51c.bigend.vect[2];
        iVar50 = local_51c.bigend.vect[1];
        iVar23 = local_51c.bigend.vect[0];
        iVar11 = local_51c.smallend.vect[2];
        iVar16 = local_51c.smallend.vect[1];
        iVar10 = local_51c.smallend.vect[0];
        lVar17 = (long)local_51c.smallend.vect[0];
        lVar53 = (long)local_51c.smallend.vect[1];
        uVar47 = local_51c.bigend.vect[0] - local_51c.smallend.vect[0];
        iVar40 = local_51c.bigend.vect[1] - local_51c.smallend.vect[1];
        local_690 = 0;
        lVar13 = 0;
        do {
          local_6a8 = iVar11;
          if (iVar11 <= iVar38) {
            do {
              if (iVar16 <= iVar50) {
                lVar42 = CONCAT44(local_498._12_4_,local_498._8_4_) * 8;
                pvVar49 = (void *)(local_498._0_8_ +
                                  CONCAT44(uStack_47c,local_498._24_4_) * local_690 +
                                  (lVar53 - local_474) * lVar42 +
                                  (long)(local_6a8 - local_470) *
                                  CONCAT44(local_498._20_4_,local_498._16_4_) * 8 +
                                  (long)local_478 * -8 + lVar17 * 8);
                iVar41 = iVar40 + 1;
                do {
                  if (iVar10 <= iVar23) {
                    memset(pvVar49,0,(ulong)uVar47 * 8 + 8);
                  }
                  pvVar49 = (void *)((long)pvVar49 + lVar42);
                  iVar41 = iVar41 + -1;
                } while (iVar41 != 0);
              }
              bVar56 = local_6a8 != iVar38;
              local_6a8 = local_6a8 + 1;
            } while (bVar56);
          }
          iVar8 = local_538.bigend.vect[2];
          iVar7 = local_538.bigend.vect[1];
          iVar6 = local_538.bigend.vect[0];
          iVar5 = local_538.smallend.vect[2];
          iVar25 = local_538.smallend.vect[1];
          iVar41 = local_538.smallend.vect[0];
          lVar13 = lVar13 + 1;
          local_690 = local_690 + 8;
        } while (lVar13 != 3);
        lVar17 = (long)local_538.smallend.vect[0];
        lVar53 = (long)local_538.smallend.vect[1];
        uVar47 = local_538.bigend.vect[0] - local_538.smallend.vect[0];
        iVar10 = local_538.bigend.vect[1] - local_538.smallend.vect[1];
        local_690 = 0;
        lVar13 = 0;
        do {
          local_6a8 = iVar5;
          if (iVar5 <= iVar8) {
            do {
              if (iVar25 <= iVar7) {
                lVar42 = local_3e8.jstride * 8;
                pvVar49 = (void *)((long)local_3e8.p +
                                  local_3e8.nstride * local_690 +
                                  (lVar53 - local_3e8.begin.y) * lVar42 +
                                  (local_6a8 - local_3e8.begin.z) * local_3e8.kstride * 8 +
                                  (long)local_3e8.begin.x * -8 + lVar17 * 8);
                iVar16 = iVar10 + 1;
                do {
                  if (iVar41 <= iVar6) {
                    memset(pvVar49,0,(ulong)uVar47 * 8 + 8);
                  }
                  pvVar49 = (void *)((long)pvVar49 + lVar42);
                  iVar16 = iVar16 + -1;
                } while (iVar16 != 0);
              }
              bVar56 = local_6a8 != iVar8;
              local_6a8 = local_6a8 + 1;
            } while (bVar56);
          }
          iVar40 = local_554.bigend.vect[2];
          iVar38 = local_554.bigend.vect[1];
          iVar50 = local_554.bigend.vect[0];
          iVar23 = local_554.smallend.vect[2];
          iVar11 = local_554.smallend.vect[1];
          iVar16 = local_554.smallend.vect[0];
          lVar13 = lVar13 + 1;
          local_690 = local_690 + 8;
        } while (lVar13 != 3);
        lVar17 = (long)local_554.smallend.vect[0];
        lVar53 = (long)local_554.smallend.vect[1];
        uVar47 = local_554.bigend.vect[0] - local_554.smallend.vect[0];
        iVar10 = local_554.bigend.vect[1] - local_554.smallend.vect[1];
        local_690 = 0;
        lVar13 = 0;
        do {
          iVar41 = iVar23;
          if (iVar23 <= iVar40) {
            do {
              if (iVar11 <= iVar38) {
                lVar42 = local_428.jstride * 8;
                pvVar49 = (void *)((long)local_428.p +
                                  local_428.nstride * local_690 +
                                  (lVar53 - local_428.begin.y) * lVar42 +
                                  (iVar41 - local_428.begin.z) * local_428.kstride * 8 +
                                  (long)local_428.begin.x * -8 + lVar17 * 8);
                iVar25 = iVar10 + 1;
                do {
                  if (iVar16 <= iVar50) {
                    memset(pvVar49,0,(ulong)uVar47 * 8 + 8);
                  }
                  pvVar49 = (void *)((long)pvVar49 + lVar42);
                  iVar25 = iVar25 + -1;
                } while (iVar25 != 0);
              }
              bVar56 = iVar41 != iVar40;
              iVar41 = iVar41 + 1;
            } while (bVar56);
          }
          lVar13 = lVar13 + 1;
          local_690 = local_690 + 8;
        } while (lVar13 != 3);
      }
      else {
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)local_498,pFVar48,(MFIter *)&local_180);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_3e8,local_430,(MFIter *)&local_180);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_428,local_438,(MFIter *)&local_180);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_500,local_440,(MFIter *)&local_180);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_280,local_448,(MFIter *)&local_180);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_2c0,local_328,(MFIter *)&local_180);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_300,local_330,(MFIter *)&local_180);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_1c0,local_450,(MFIter *)&local_180);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_200,local_318,(MFIter *)&local_180);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_240,local_320,(MFIter *)&local_180);
        if (FVar9 == regular) {
          if (local_51c.smallend.vect[2] <= local_51c.bigend.vect[2]) {
            lVar53 = (long)local_51c.smallend.vect[1];
            lVar13 = (long)local_51c.smallend.vect[0] * 8;
            iVar10 = local_51c.smallend.vect[2] + -1;
            iVar16 = local_51c.smallend.vect[2];
            iVar11 = local_51c.smallend.vect[2];
            do {
              iVar16 = iVar16 + 1;
              if (local_51c.smallend.vect[1] <= local_51c.bigend.vect[1]) {
                lVar51 = (long)iVar11;
                lVar18 = local_500.kstride * (iVar11 - local_500.begin.z);
                lVar42 = (long)local_478;
                lVar35 = CONCAT44(local_498._12_4_,local_498._8_4_) * 8;
                lVar17 = (lVar53 - local_474) * lVar35 +
                         (lVar51 - local_470) * CONCAT44(local_498._20_4_,local_498._16_4_) * 8;
                lVar30 = local_498._0_8_ + lVar17 + lVar42 * -8 + lVar13;
                lVar45 = local_498._0_8_ +
                         lVar17 + CONCAT44(uStack_47c,local_498._24_4_) * 8 + lVar42 * -8 + lVar13;
                lVar26 = local_498._0_8_ +
                         CONCAT44(uStack_47c,local_498._24_4_) * 0x10 + lVar17 + lVar42 * -8 +
                         lVar13;
                lVar36 = local_280.jstride * 8;
                lVar17 = (lVar53 - local_280.begin.y) * lVar36 +
                         (lVar51 - local_280.begin.z) * local_280.kstride * 8;
                lVar20 = (long)local_280.p + lVar17 + (long)local_280.begin.x * -8 + lVar13;
                lVar29 = (long)local_280.p +
                         lVar17 + local_280.nstride * 8 + (long)local_280.begin.x * -8 + lVar13;
                lVar17 = local_500.jstride * 8;
                lVar42 = (lVar53 - local_500.begin.y) * lVar17;
                lVar19 = local_500.kstride * 8;
                lVar15 = (iVar10 - local_500.begin.z) * lVar19 + lVar42;
                lVar42 = (iVar16 - local_500.begin.z) * lVar19 + lVar42;
                lVar19 = (lVar51 - local_500.begin.z) * lVar19;
                lVar27 = (long)local_500.begin.x;
                lVar43 = (long)local_500.p +
                         local_500.nstride * 0x10 + lVar15 + lVar27 * -8 + lVar13;
                lVar15 = (long)local_500.p + lVar15 + lVar27 * -8 + lVar13;
                lVar24 = (long)local_500.p +
                         local_500.nstride * 0x10 + lVar42 + lVar27 * -8 + lVar13;
                lVar21 = (long)local_500.p + lVar42 + lVar27 * -8 + lVar13;
                lVar42 = lVar19 + lVar27 * -8 + lVar13;
                lVar27 = local_500.nstride * 8 + lVar19 + lVar27 * -8 + lVar13;
                lVar51 = (long)local_1c0.p +
                         (lVar53 - local_1c0.begin.y) * local_1c0.jstride * 8 +
                         (lVar51 - local_1c0.begin.z) * local_1c0.kstride * 8 +
                         (long)local_1c0.begin.x * -8 + lVar13;
                iVar23 = (local_51c.smallend.vect[1] + 1) - local_500.begin.y;
                iVar50 = (local_51c.smallend.vect[1] + -1) - local_500.begin.y;
                local_628 = lVar53;
                do {
                  if (local_51c.smallend.vect[0] <= local_51c.bigend.vect[0]) {
                    lVar19 = (local_628 - local_500.begin.y) * local_500.jstride;
                    lVar44 = 0;
                    do {
                      dVar58 = *(double *)
                                ((long)local_500.p + lVar44 * 8 + iVar23 * lVar17 + lVar42);
                      lVar46 = (long)(((local_51c.smallend.vect[0] + -1) - local_500.begin.x) +
                                     (int)lVar44);
                      dVar64 = local_500.p
                               [(((int)local_628 - local_500.begin.y) + 1) * local_500.jstride +
                                lVar18 + lVar46];
                      dVar57 = *(double *)
                                ((long)local_500.p + lVar44 * 8 + iVar50 * lVar17 + lVar42);
                      dVar59 = local_500.p
                               [(~local_500.begin.y + (int)local_628) * local_500.jstride +
                                lVar18 + lVar46];
                      dVar60 = *(double *)(lVar21 + lVar44 * 8);
                      dVar2 = local_500.p
                              [lVar19 + lVar46 + ((iVar11 - local_500.begin.z) + 1) *
                                                 local_500.kstride];
                      dVar63 = *(double *)(lVar15 + lVar44 * 8);
                      dVar65 = local_500.p
                               [lVar19 + lVar46 + (~local_500.begin.z + iVar11) * local_500.kstride]
                      ;
                      dVar62 = (((*(double *)(lVar24 + lVar44 * 8) +
                                 (local_500.p +
                                 lVar19 + lVar46 + ((iVar11 - local_500.begin.z) + 1) *
                                                   local_500.kstride)[local_500.nstride * 2]) -
                                *(double *)(lVar43 + lVar44 * 8)) -
                               (local_500.p +
                               lVar19 + lVar46 + (~local_500.begin.z + iVar11) * local_500.kstride)
                               [local_500.nstride * 2]) * local_4b8 +
                               (((*(double *)
                                   ((long)local_500.p + lVar44 * 8 + iVar23 * lVar17 + lVar27) +
                                 (local_500.p +
                                 (((int)local_628 - local_500.begin.y) + 1) * local_500.jstride +
                                 lVar18 + lVar46)[local_500.nstride]) -
                                *(double *)
                                 ((long)local_500.p + lVar44 * 8 + iVar50 * lVar17 + lVar27)) -
                               (local_500.p +
                               (~local_500.begin.y + (int)local_628) * local_500.jstride +
                               lVar18 + lVar46)[local_500.nstride]) * local_4b0;
                      dVar3 = *(double *)(lVar51 + lVar44 * 8);
                      dVar61 = *(double *)(lVar29 + lVar44 * 8);
                      *(double *)(lVar30 + lVar44 * 8) =
                           dVar62 * -0.6666666666666666 *
                           (*(double *)(lVar20 + lVar44 * 8) - dVar3) * -0.75 - dVar62 * dVar3;
                      dVar61 = -dVar61;
                      *(double *)(lVar45 + lVar44 * 8) =
                           (((dVar58 + dVar64) - dVar57) - dVar59) * local_4b0 * dVar61;
                      *(double *)(lVar26 + lVar44 * 8) =
                           dVar61 * (((dVar60 + dVar2) - dVar63) - dVar65) * local_4b8;
                      lVar44 = lVar44 + 1;
                    } while ((local_51c.bigend.vect[0] - local_51c.smallend.vect[0]) + 1 !=
                             (int)lVar44);
                  }
                  local_628 = local_628 + 1;
                  lVar30 = lVar30 + lVar35;
                  lVar45 = lVar45 + lVar35;
                  lVar26 = lVar26 + lVar35;
                  lVar20 = lVar20 + lVar36;
                  lVar29 = lVar29 + lVar36;
                  lVar43 = lVar43 + lVar17;
                  lVar15 = lVar15 + lVar17;
                  lVar24 = lVar24 + lVar17;
                  lVar21 = lVar21 + lVar17;
                  iVar23 = iVar23 + 1;
                  iVar50 = iVar50 + 1;
                  lVar51 = lVar51 + local_1c0.jstride * 8;
                } while (local_51c.bigend.vect[1] + 1 != (int)local_628);
              }
              iVar10 = iVar10 + 1;
              bVar56 = iVar11 != local_51c.bigend.vect[2];
              iVar11 = iVar11 + 1;
            } while (bVar56);
          }
          if (local_538.smallend.vect[2] <= local_538.bigend.vect[2]) {
            lVar53 = (long)local_538.smallend.vect[1];
            lVar13 = (long)local_538.smallend.vect[0] * 8;
            iVar10 = local_538.smallend.vect[2] + -1;
            local_49c = local_538.smallend.vect[0] + -1;
            iVar16 = local_538.smallend.vect[2];
            iVar11 = local_538.smallend.vect[2];
            do {
              iVar11 = iVar11 + 1;
              if (local_538.smallend.vect[1] <= local_538.bigend.vect[1]) {
                lVar51 = (long)iVar16;
                lVar42 = (long)local_3e8.begin.x;
                lVar15 = local_3e8.jstride * 8;
                lVar17 = (lVar53 - local_3e8.begin.y) * lVar15 +
                         (lVar51 - local_3e8.begin.z) * local_3e8.kstride * 8;
                lVar30 = (long)local_3e8.p + lVar17 + lVar42 * -8 + lVar13;
                lVar18 = (long)local_3e8.p + lVar17 + local_3e8.nstride * 8 + lVar42 * -8 + lVar13;
                lVar24 = (long)local_3e8.p +
                         local_3e8.nstride * 0x10 + lVar17 + lVar42 * -8 + lVar13;
                lVar44 = local_2c0.jstride * 8;
                lVar17 = (lVar53 - local_2c0.begin.y) * lVar44 +
                         (lVar51 - local_2c0.begin.z) * local_2c0.kstride * 8;
                lVar21 = (long)local_2c0.p +
                         lVar17 + local_2c0.nstride * 8 + (long)local_2c0.begin.x * -8 + lVar13;
                lVar45 = (long)local_2c0.p + lVar17 + (long)local_2c0.begin.x * -8 + lVar13;
                lVar17 = local_500.jstride * 8;
                lVar29 = (lVar53 - local_500.begin.y) * lVar17;
                lVar42 = local_500.kstride * 8;
                lVar36 = (iVar10 - local_500.begin.z) * lVar42;
                lVar27 = local_500.nstride * 0x10;
                lVar26 = (long)local_500.begin.x;
                local_630 = (long)local_500.p + lVar29 + lVar36 + lVar27 + lVar26 * -8 + lVar13;
                lVar54 = (long)local_500.p +
                         lVar29 + lVar36 + local_500.nstride * 8 + lVar26 * -8 + lVar13;
                lVar19 = (iVar11 - local_500.begin.z) * lVar42;
                lVar46 = (long)local_500.p + lVar29 + lVar19 + lVar27 + lVar26 * -8 + lVar13;
                lVar35 = (long)local_500.p +
                         lVar29 + lVar19 + local_500.nstride * 8 + lVar26 * -8 + lVar13;
                lVar43 = (long)local_200.p +
                         (lVar53 - local_200.begin.y) * local_200.jstride * 8 +
                         (lVar51 - local_200.begin.z) * local_200.kstride * 8 +
                         (long)local_200.begin.x * -8 + lVar13;
                lVar29 = lVar42 * (lVar51 - local_500.begin.z) + lVar29;
                lVar42 = (long)local_500.p + lVar29 + lVar26 * -8 + lVar13 + 8;
                lVar20 = (long)local_500.p +
                         lVar29 + local_500.nstride * 8 + lVar26 * -8 + lVar13 + 8;
                lVar29 = (iVar16 - local_500.begin.z) * local_500.kstride;
                iVar23 = (local_538.smallend.vect[1] + -1) - local_500.begin.y;
                local_628 = lVar53;
                do {
                  if (local_538.smallend.vect[0] <= local_538.bigend.vect[0]) {
                    lVar33 = lVar17 * iVar23;
                    lVar22 = iVar23 * local_500.jstride +
                             (lVar51 - local_500.begin.z) * local_500.kstride +
                             (long)local_538.smallend.vect[0];
                    lVar32 = 0;
                    do {
                      lVar34 = (long)((local_49c - local_500.begin.x) + (int)lVar32);
                      dVar58 = *(double *)(lVar35 + lVar32 * 8);
                      dVar64 = *(double *)
                                ((long)local_500.p +
                                lVar32 * 8 +
                                lVar33 + local_500.nstride * 8 + lVar19 + lVar26 * -8 + lVar13);
                      dVar57 = *(double *)(lVar54 + lVar32 * 8);
                      dVar59 = *(double *)
                                ((long)local_500.p +
                                lVar32 * 8 +
                                lVar33 + lVar36 + local_500.nstride * 8 + lVar26 * -8 + lVar13);
                      dVar63 = (((*(double *)(lVar46 + lVar32 * 8) +
                                 *(double *)
                                  ((long)local_500.p +
                                  lVar32 * 8 + lVar33 + lVar27 + lVar19 + lVar26 * -8 + lVar13)) -
                                *(double *)(local_630 + lVar32 * 8)) -
                               *(double *)
                                ((long)local_500.p +
                                lVar32 * 8 + lVar33 + lVar36 + lVar27 + lVar26 * -8 + lVar13)) *
                               local_4b8 +
                               (((*(double *)(lVar42 + lVar32 * 8) +
                                 local_500.p[(lVar22 + lVar32 + 1) - lVar26]) -
                                local_500.p
                                [(local_628 - local_500.begin.y) * local_500.jstride +
                                 lVar29 + lVar34]) -
                               local_500.p
                               [(~local_500.begin.y + (int)local_628) * local_500.jstride +
                                lVar29 + lVar34]) * local_4a8;
                      dVar60 = *(double *)(lVar43 + lVar32 * 8);
                      dVar2 = *(double *)(lVar21 + lVar32 * 8);
                      dVar65 = -*(double *)(lVar45 + lVar32 * 8);
                      *(double *)(lVar30 + lVar32 * 8) =
                           (((*(double *)(lVar20 + lVar32 * 8) +
                             local_500.p[(local_500.nstride + lVar22 + lVar32 + 1) - lVar26]) -
                            (local_500.p +
                            (local_628 - local_500.begin.y) * local_500.jstride + lVar29 + lVar34)
                            [local_500.nstride]) -
                           (local_500.p +
                           (~local_500.begin.y + (int)local_628) * local_500.jstride +
                           lVar29 + lVar34)[local_500.nstride]) * local_4a8 * dVar65;
                      *(double *)(lVar18 + lVar32 * 8) =
                           dVar63 * -0.6666666666666666 * (dVar2 - dVar60) * -0.75 - dVar63 * dVar60
                      ;
                      *(double *)(lVar24 + lVar32 * 8) =
                           dVar65 * (((dVar58 + dVar64) - dVar57) - dVar59) * local_4b8;
                      lVar32 = lVar32 + 1;
                    } while ((local_538.bigend.vect[0] - local_538.smallend.vect[0]) + 1 !=
                             (int)lVar32);
                  }
                  local_628 = local_628 + 1;
                  lVar30 = lVar30 + lVar15;
                  lVar18 = lVar18 + lVar15;
                  lVar24 = lVar24 + lVar15;
                  lVar21 = lVar21 + lVar44;
                  lVar45 = lVar45 + lVar44;
                  local_630 = local_630 + lVar17;
                  lVar54 = lVar54 + lVar17;
                  lVar46 = lVar46 + lVar17;
                  lVar35 = lVar35 + lVar17;
                  iVar23 = iVar23 + 1;
                  lVar43 = lVar43 + local_200.jstride * 8;
                  lVar42 = lVar42 + lVar17;
                  lVar20 = lVar20 + lVar17;
                } while (local_538.bigend.vect[1] + 1 != (int)local_628);
              }
              iVar10 = iVar10 + 1;
              bVar56 = iVar16 != local_538.bigend.vect[2];
              iVar16 = iVar16 + 1;
            } while (bVar56);
          }
          if (local_554.smallend.vect[2] <= local_554.bigend.vect[2]) {
            lVar53 = (long)local_554.smallend.vect[1];
            lVar13 = (long)local_554.smallend.vect[0] * 8;
            iVar10 = local_554.smallend.vect[2] + -1;
            iVar16 = local_554.smallend.vect[2];
            do {
              if (local_554.smallend.vect[1] <= local_554.bigend.vect[1]) {
                lVar42 = (long)iVar16;
                lVar27 = (long)local_428.begin.x;
                lVar36 = local_428.jstride * 8;
                lVar17 = (lVar53 - local_428.begin.y) * lVar36 +
                         (lVar42 - local_428.begin.z) * local_428.kstride * 8;
                lVar43 = (long)local_428.p + lVar17 + lVar27 * -8 + lVar13;
                local_648 = (long)local_428.p +
                            lVar17 + local_428.nstride * 8 + lVar27 * -8 + lVar13;
                lVar20 = (long)local_428.p +
                         local_428.nstride * 0x10 + lVar17 + lVar27 * -8 + lVar13;
                lVar21 = local_300.jstride * 8;
                lVar17 = (lVar53 - local_300.begin.y) * lVar21 +
                         (lVar42 - local_300.begin.z) * local_300.kstride * 8;
                lVar35 = (long)local_300.p + lVar17 + (long)local_300.begin.x * -8 + lVar13;
                lVar26 = (long)local_300.p +
                         local_300.nstride * 0x10 + lVar17 + (long)local_300.begin.x * -8 + lVar13;
                lVar45 = (long)(iVar10 - local_500.begin.z) * local_500.kstride * 8;
                lVar15 = (lVar42 - local_500.begin.z) * local_500.kstride * 8;
                lVar30 = (long)local_240.p +
                         (lVar53 - local_240.begin.y) * local_240.jstride * 8 +
                         (lVar42 - local_240.begin.z) * local_240.kstride * 8 +
                         (long)local_240.begin.x * -8 + lVar13;
                lVar27 = local_500.nstride * 0x10;
                lVar24 = (long)local_500.begin.x;
                lVar17 = local_500.jstride * 8;
                lVar18 = (lVar53 - local_500.begin.y) * lVar17;
                lVar42 = lVar45 + lVar18;
                lVar18 = lVar18 + lVar15;
                lVar51 = lVar45 + lVar27 + lVar24 * -8 + lVar13;
                lVar45 = lVar45 + local_500.nstride * 8 + lVar24 * -8 + lVar13;
                lVar29 = lVar15 + lVar27 + lVar24 * -8 + lVar13;
                lVar15 = lVar15 + local_500.nstride * 8 + lVar24 * -8 + lVar13;
                lVar19 = (long)local_500.p + lVar27 + lVar42 + lVar24 * -8 + lVar13 + 8;
                lVar42 = (long)local_500.p + lVar42 + lVar24 * -8 + 8 + lVar13;
                lVar27 = (long)local_500.p + lVar27 + lVar18 + lVar24 * -8 + 8 + lVar13;
                lVar18 = (long)local_500.p + lVar18 + lVar24 * -8 + 8 + lVar13;
                iVar11 = (local_554.smallend.vect[1] + 1) - local_500.begin.y;
                iVar23 = (local_554.smallend.vect[1] + -1) - local_500.begin.y;
                local_630 = lVar53;
                do {
                  if (local_554.smallend.vect[0] <= local_554.bigend.vect[0]) {
                    lVar54 = iVar11 * lVar17;
                    lVar24 = iVar23 * lVar17;
                    lVar44 = (local_630 - local_500.begin.y) * local_500.jstride;
                    lVar46 = 0;
                    do {
                      lVar22 = (long)(((local_554.smallend.vect[0] + -1) - local_500.begin.x) +
                                     (int)lVar46);
                      dVar58 = *(double *)((long)local_500.p + lVar46 * 8 + lVar54 + lVar29);
                      dVar64 = *(double *)((long)local_500.p + lVar46 * 8 + lVar54 + lVar51);
                      dVar57 = *(double *)((long)local_500.p + lVar46 * 8 + lVar24 + lVar29);
                      dVar59 = *(double *)((long)local_500.p + lVar46 * 8 + lVar24 + lVar51);
                      dVar63 = (((*(double *)((long)local_500.p + lVar46 * 8 + lVar54 + lVar15) +
                                 *(double *)((long)local_500.p + lVar46 * 8 + lVar54 + lVar45)) -
                                *(double *)((long)local_500.p + lVar46 * 8 + lVar24 + lVar15)) -
                               *(double *)((long)local_500.p + lVar46 * 8 + lVar24 + lVar45)) *
                               local_4b0 +
                               (((*(double *)(lVar18 + lVar46 * 8) +
                                 *(double *)(lVar42 + lVar46 * 8)) -
                                local_500.p
                                [lVar44 + lVar22 + (iVar16 - local_500.begin.z) * local_500.kstride]
                                ) - local_500.p
                                    [lVar44 + lVar22 + (~local_500.begin.z + iVar16) *
                                                       local_500.kstride]) * local_4a8;
                      dVar60 = *(double *)(lVar30 + lVar46 * 8);
                      dVar2 = *(double *)(lVar26 + lVar46 * 8);
                      dVar65 = -*(double *)(lVar35 + lVar46 * 8);
                      *(double *)(lVar43 + lVar46 * 8) =
                           (((*(double *)(lVar27 + lVar46 * 8) + *(double *)(lVar19 + lVar46 * 8)) -
                            (local_500.p +
                            lVar44 + lVar22 + (iVar16 - local_500.begin.z) * local_500.kstride)
                            [local_500.nstride * 2]) -
                           (local_500.p +
                           lVar44 + lVar22 + (~local_500.begin.z + iVar16) * local_500.kstride)
                           [local_500.nstride * 2]) * local_4a8 * dVar65;
                      *(double *)(local_648 + lVar46 * 8) =
                           dVar65 * (((dVar58 + dVar64) - dVar57) - dVar59) * local_4b0;
                      *(double *)(lVar20 + lVar46 * 8) =
                           dVar63 * -0.6666666666666666 * (dVar2 - dVar60) * -0.75 - dVar63 * dVar60
                      ;
                      lVar46 = lVar46 + 1;
                    } while ((local_554.bigend.vect[0] - local_554.smallend.vect[0]) + 1 !=
                             (int)lVar46);
                  }
                  local_630 = local_630 + 1;
                  lVar43 = lVar43 + lVar36;
                  local_648 = local_648 + lVar36;
                  lVar20 = lVar20 + lVar36;
                  lVar35 = lVar35 + lVar21;
                  lVar26 = lVar26 + lVar21;
                  iVar11 = iVar11 + 1;
                  iVar23 = iVar23 + 1;
                  lVar30 = lVar30 + local_240.jstride * 8;
                  lVar19 = lVar19 + lVar17;
                  lVar42 = lVar42 + lVar17;
                  lVar27 = lVar27 + lVar17;
                  lVar18 = lVar18 + lVar17;
                } while (local_554.bigend.vect[1] + 1 != (int)local_630);
              }
              iVar10 = iVar10 + 1;
              bVar56 = iVar16 != local_554.bigend.vect[2];
              iVar16 = iVar16 + 1;
            } while (bVar56);
          }
        }
        else {
          MultiCutFab::const_array(&local_a0,local_368,(MFIter *)&local_180);
          MultiCutFab::const_array(&local_e0,pMStack_360,(MFIter *)&local_180);
          MultiCutFab::const_array(&local_120,local_358,(MFIter *)&local_180);
          FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                    (&local_3a8,local_4c0,(MFIter *)&local_180);
          if (local_51c.smallend.vect[2] <= local_51c.bigend.vect[2]) {
            lVar53 = (long)local_51c.smallend.vect[0];
            lVar13 = lVar53 * 8;
            iVar10 = local_51c.smallend.vect[2];
            do {
              if (local_51c.smallend.vect[1] <= local_51c.bigend.vect[1]) {
                lVar42 = (long)iVar10;
                lVar17 = (long)local_a0.p +
                         ((long)local_51c.smallend.vect[1] - (long)local_a0.begin.y) *
                         local_a0.jstride * 8 + (lVar42 - local_a0.begin.z) * local_a0.kstride * 8 +
                         (long)local_a0.begin.x * -8 + lVar13;
                local_6a0 = (long)local_51c.smallend.vect[1];
                do {
                  if (local_51c.smallend.vect[0] <= local_51c.bigend.vect[0]) {
                    lVar29 = (long)local_500.begin.x;
                    lVar35 = (long)local_500.begin.y;
                    lVar43 = (long)local_478;
                    lVar54 = (local_6a0 - local_3a8.begin.y) * local_3a8.jstride;
                    lVar46 = (lVar42 - local_3a8.begin.z) * local_3a8.kstride;
                    lVar19 = local_500.jstride * 8;
                    lVar26 = local_500.kstride * 8;
                    lVar51 = (lVar42 - local_500.begin.z) * lVar26;
                    lVar27 = (local_6a0 - lVar35) * lVar19;
                    lVar18 = lVar51 + local_500.nstride * 8 + lVar29 * -8 + lVar13;
                    lVar51 = lVar51 + lVar29 * -8 + lVar13;
                    lVar45 = local_500.nstride * 0x10 + lVar27 + lVar29 * -8 + lVar13;
                    lVar29 = lVar27 + lVar29 * -8 + lVar13;
                    lVar27 = CONCAT44(uStack_47c,local_498._24_4_);
                    lVar30 = (local_6a0 - local_474) * CONCAT44(local_498._12_4_,local_498._8_4_);
                    lVar36 = (lVar42 - local_470) * CONCAT44(local_498._20_4_,local_498._16_4_);
                    lVar15 = (local_6a0 - local_280.begin.y) * local_280.jstride;
                    lVar20 = (lVar42 - local_280.begin.z) * local_280.kstride;
                    iVar16 = (int)local_6a0;
                    lVar24 = -lVar35;
                    lVar44 = -(long)local_500.begin.z;
                    lVar21 = 0;
                    do {
                      dVar58 = *(double *)(lVar17 + lVar21 * 8);
                      if ((dVar58 != 0.0) || (NAN(dVar58))) {
                        uVar47 = local_3a8.p
                                 [lVar53 + ((lVar54 + lVar46 + lVar21) - (long)local_3a8.begin.x)].
                                 flag;
                        uVar28 = uVar47 >> 0x15 & 1;
                        iVar11 = (int)(short)uVar47 >> 0xf;
                        iVar23 = uVar28 - iVar11;
                        dVar58 = 1.0;
                        if (iVar23 != 1) {
                          dVar58 = 0.0;
                        }
                        dVar64 = 0.5;
                        if (iVar23 != 2) {
                          dVar64 = dVar58;
                        }
                        uVar4 = local_3a8.p
                                [lVar53 + ((lVar54 + lVar46 + lVar21 + -1) - (long)local_3a8.begin.x
                                          )].flag;
                        uVar52 = uVar4 >> 0x15 & 1;
                        iVar50 = (int)(short)uVar4 >> 0xf;
                        iVar23 = uVar52 - iVar50;
                        dVar58 = 1.0;
                        if (iVar23 != 1) {
                          dVar58 = 0.0;
                        }
                        dVar57 = 0.5;
                        if (iVar23 != 2) {
                          dVar57 = dVar58;
                        }
                        uVar12 = uVar47 >> 0x1b & 1;
                        iVar38 = (int)(uVar47 << 0x16) >> 0x1f;
                        iVar23 = uVar12 - iVar38;
                        dVar58 = 1.0;
                        if (iVar23 != 1) {
                          dVar58 = 0.0;
                        }
                        dVar59 = 0.5;
                        if (iVar23 != 2) {
                          dVar59 = dVar58;
                        }
                        uVar47 = uVar4 >> 0x1b & 1;
                        iVar40 = (int)(uVar4 << 0x16) >> 0x1f;
                        iVar23 = uVar47 - iVar40;
                        dVar58 = 1.0;
                        if (iVar23 != 1) {
                          dVar58 = 0.0;
                        }
                        dVar60 = 0.5;
                        if (iVar23 != 2) {
                          dVar60 = dVar58;
                        }
                        lVar55 = ((ulong)uVar28 + (iVar16 - lVar35)) * lVar19;
                        dVar58 = *(double *)((long)local_500.p + lVar21 * 8 + lVar55 + lVar51);
                        lVar22 = ((iVar11 + iVar16) + lVar24) * lVar19;
                        dVar2 = *(double *)((long)local_500.p + lVar21 * 8 + lVar22 + lVar51);
                        lVar39 = ((int)(uVar52 + iVar16) + lVar24) * lVar19;
                        dVar63 = *(double *)((long)local_500.p + lVar21 * 8 + lVar39 + lVar51 + -8);
                        lVar33 = ((iVar50 + iVar16) + lVar24) * lVar19;
                        dVar65 = *(double *)((long)local_500.p + lVar21 * 8 + lVar33 + lVar51 + -8);
                        lVar32 = ((int)(uVar12 + iVar10) + lVar44) * lVar26;
                        dVar3 = *(double *)((long)local_500.p + lVar21 * 8 + lVar32 + lVar29);
                        lVar31 = ((iVar38 + iVar10) + lVar44) * lVar26;
                        dVar61 = *(double *)((long)local_500.p + lVar21 * 8 + lVar31 + lVar29);
                        lVar34 = ((int)(uVar47 + iVar10) + lVar44) * lVar26;
                        dVar62 = *(double *)((long)local_500.p + lVar21 * 8 + lVar34 + lVar29 + -8);
                        lVar37 = ((iVar40 + iVar10) + lVar44) * lVar26;
                        dVar66 = *(double *)((long)local_500.p + lVar21 * 8 + lVar37 + lVar29 + -8);
                        dVar67 = ((*(double *)((long)local_500.p + lVar21 * 8 + lVar32 + lVar45) -
                                  *(double *)((long)local_500.p + lVar21 * 8 + lVar31 + lVar45)) *
                                  dVar59 + (*(double *)
                                             ((long)local_500.p + lVar21 * 8 + lVar34 + lVar45 + -8)
                                           - *(double *)
                                              ((long)local_500.p + lVar21 * 8 + lVar37 + lVar45 + -8
                                              )) * dVar60) * local_340 +
                                 ((*(double *)((long)local_500.p + lVar21 * 8 + lVar55 + lVar18) -
                                  *(double *)((long)local_500.p + lVar21 * 8 + lVar22 + lVar18)) *
                                  dVar64 + (*(double *)
                                             ((long)local_500.p + lVar21 * 8 + lVar39 + lVar18 + -8)
                                           - *(double *)
                                              ((long)local_500.p + lVar21 * 8 + lVar33 + lVar18 + -8
                                              )) * dVar57) * local_338;
                        dVar1 = local_280.p
                                [lVar53 + ((local_280.nstride + lVar15 + lVar20 + lVar21) -
                                          (long)local_280.begin.x)];
                        *(double *)
                         (local_498._0_8_ + (lVar53 + ((lVar30 + lVar36 + lVar21) - lVar43)) * 8) =
                             dVar67 * -0.6666666666666666 *
                             (local_280.p
                              [lVar53 + ((lVar15 + lVar20 + lVar21) - (long)local_280.begin.x)] -
                             local_1c0.p
                             [lVar53 + (((local_6a0 - local_1c0.begin.y) * local_1c0.jstride +
                                        (lVar42 - local_1c0.begin.z) * local_1c0.kstride + lVar21) -
                                       (long)local_1c0.begin.x)]) * -0.75 -
                             dVar67 * local_1c0.p
                                      [lVar53 + (((local_6a0 - local_1c0.begin.y) *
                                                  local_1c0.jstride +
                                                 (lVar42 - local_1c0.begin.z) * local_1c0.kstride +
                                                 lVar21) - (long)local_1c0.begin.x)];
                        *(double *)
                         (local_498._0_8_ +
                         (lVar53 + ((lVar27 + lVar30 + lVar36 + lVar21) - lVar43)) * 8) =
                             ((dVar58 - dVar2) * dVar64 + (dVar63 - dVar65) * dVar57) * local_338 *
                             -dVar1;
                        *(double *)
                         (local_498._0_8_ +
                         (lVar53 + ((lVar30 + lVar36 + lVar27 * 2 + lVar21) - lVar43)) * 8) =
                             -dVar1 * ((dVar3 - dVar61) * dVar59 + (dVar62 - dVar66) * dVar60) *
                                      local_340;
                      }
                      else {
                        *(double *)
                         (local_498._0_8_ + (lVar53 + ((lVar30 + lVar36 + lVar21) - lVar43)) * 8) =
                             0.0;
                        *(double *)
                         (local_498._0_8_ +
                         (lVar53 + ((lVar27 + lVar30 + lVar36 + lVar21) - lVar43)) * 8) = 0.0;
                        *(double *)
                         (local_498._0_8_ +
                         (lVar53 + ((lVar30 + lVar36 + lVar27 * 2 + lVar21) - lVar43)) * 8) = 0.0;
                      }
                      lVar21 = lVar21 + 1;
                    } while ((local_51c.bigend.vect[0] - local_51c.smallend.vect[0]) + 1 !=
                             (int)lVar21);
                  }
                  local_6a0 = local_6a0 + 1;
                  lVar17 = lVar17 + local_a0.jstride * 8;
                } while (local_51c.bigend.vect[1] + 1 != (int)local_6a0);
              }
              bVar56 = iVar10 != local_51c.bigend.vect[2];
              iVar10 = iVar10 + 1;
            } while (bVar56);
          }
          if (local_538.smallend.vect[2] <= local_538.bigend.vect[2]) {
            lVar53 = (long)local_538.smallend.vect[1];
            lVar17 = (long)local_538.smallend.vect[0];
            lVar13 = lVar17 * 8;
            iVar10 = local_538.smallend.vect[2];
            do {
              if (local_538.smallend.vect[1] <= local_538.bigend.vect[1]) {
                lVar27 = (long)iVar10;
                lVar42 = (long)local_e0.p +
                         (lVar53 - local_e0.begin.y) * local_e0.jstride * 8 +
                         (lVar27 - local_e0.begin.z) * local_e0.kstride * 8 +
                         (long)local_e0.begin.x * -8 + lVar13;
                local_680 = lVar53;
                local_638 = lVar53 + -1;
                do {
                  if (local_538.smallend.vect[0] <= local_538.bigend.vect[0]) {
                    lVar15 = (long)local_500.begin.x;
                    lVar45 = local_680 - local_500.begin.y;
                    lVar19 = local_500.jstride * lVar45;
                    lVar26 = (lVar27 - local_500.begin.z) * local_500.kstride;
                    lVar20 = (lVar45 + -1) * local_500.jstride;
                    lVar46 = (long)local_3e8.begin.x;
                    lVar43 = (local_680 - local_3e8.begin.y) * local_3e8.jstride;
                    lVar30 = (lVar27 - local_3e8.begin.z) * local_3e8.kstride;
                    lVar35 = (local_680 - local_2c0.begin.y) * local_2c0.jstride;
                    lVar36 = (lVar27 - local_2c0.begin.z) * local_2c0.kstride;
                    lVar45 = lVar45 * local_500.jstride * 8;
                    lVar18 = (local_638 - local_500.begin.y) * local_500.jstride * 8;
                    lVar51 = lVar45 + local_500.nstride * 0x10 + lVar15 * -8 + lVar13;
                    lVar45 = lVar45 + local_500.nstride * 8 + lVar15 * -8 + lVar13;
                    lVar29 = local_500.nstride * 0x10 + lVar18 + lVar15 * -8 + lVar13;
                    lVar15 = lVar18 + local_500.nstride * 8 + lVar15 * -8 + lVar13;
                    lVar21 = (lVar27 - local_3a8.begin.z) * local_3a8.kstride;
                    lVar24 = local_500.kstride * 8;
                    lVar18 = -(long)local_500.begin.z;
                    lVar44 = 0;
                    do {
                      dVar64 = 1.0;
                      dVar58 = *(double *)(lVar42 + lVar44 * 8);
                      if ((dVar58 != 0.0) || (NAN(dVar58))) {
                        uVar47 = *(uint32_t *)
                                  ((long)&local_3a8.p
                                          [lVar17 + ((lVar21 + lVar44) - (long)local_3a8.begin.x)].
                                          flag +
                                  (local_680 - local_3a8.begin.y) * local_3a8.jstride * 4);
                        uVar28 = uVar47 >> 0x13 & 1;
                        iVar11 = (int)(uVar47 << 0xe) >> 0x1f;
                        iVar16 = uVar28 - iVar11;
                        dVar58 = 1.0;
                        if (iVar16 != 1) {
                          dVar58 = 0.0;
                        }
                        dVar57 = 0.5;
                        if (iVar16 != 2) {
                          dVar57 = dVar58;
                        }
                        uVar4 = *(uint32_t *)
                                 ((long)&local_3a8.p
                                         [lVar17 + ((lVar21 + lVar44) - (long)local_3a8.begin.x)].
                                         flag +
                                 (local_638 - local_3a8.begin.y) * local_3a8.jstride * 4);
                        uVar52 = uVar4 >> 0x13 & 1;
                        iVar23 = (int)(uVar4 << 0xe) >> 0x1f;
                        iVar16 = uVar52 - iVar23;
                        dVar58 = 1.0;
                        if (iVar16 != 1) {
                          dVar58 = 0.0;
                        }
                        dVar59 = 0.5;
                        if (iVar16 != 2) {
                          dVar59 = dVar58;
                        }
                        uVar12 = uVar47 >> 0x1b & 1;
                        iVar50 = (int)(uVar47 << 0x16) >> 0x1f;
                        iVar16 = uVar12 - iVar50;
                        dVar58 = 1.0;
                        if (iVar16 != 1) {
                          dVar58 = 0.0;
                        }
                        dVar60 = 0.5;
                        if (iVar16 != 2) {
                          dVar60 = dVar58;
                        }
                        uVar47 = uVar4 >> 0x1b & 1;
                        iVar38 = (int)(uVar4 << 0x16) >> 0x1f;
                        iVar16 = uVar47 - iVar38;
                        if (iVar16 != 1) {
                          dVar64 = 0.0;
                        }
                        dVar58 = 0.5;
                        if (iVar16 != 2) {
                          dVar58 = dVar64;
                        }
                        iVar16 = (local_538.smallend.vect[0] - local_500.begin.x) + (int)lVar44;
                        lVar32 = (long)(int)(uVar28 + iVar16);
                        lVar54 = (long)(int)(uVar52 + iVar16);
                        lVar22 = ((int)(uVar12 + iVar10) + lVar18) * lVar24;
                        dVar64 = *(double *)((long)local_500.p + lVar44 * 8 + lVar22 + lVar45);
                        lVar39 = ((iVar50 + iVar10) + lVar18) * lVar24;
                        dVar2 = *(double *)((long)local_500.p + lVar44 * 8 + lVar39 + lVar45);
                        lVar33 = ((int)(uVar47 + iVar10) + lVar18) * lVar24;
                        dVar63 = *(double *)((long)local_500.p + lVar44 * 8 + lVar33 + lVar15);
                        lVar34 = ((iVar38 + iVar10) + lVar18) * lVar24;
                        dVar65 = *(double *)((long)local_500.p + lVar44 * 8 + lVar34 + lVar15);
                        dVar66 = ((*(double *)((long)local_500.p + lVar44 * 8 + lVar22 + lVar51) -
                                  *(double *)((long)local_500.p + lVar44 * 8 + lVar39 + lVar51)) *
                                  dVar60 + (*(double *)
                                             ((long)local_500.p + lVar44 * 8 + lVar33 + lVar29) -
                                           *(double *)
                                            ((long)local_500.p + lVar44 * 8 + lVar34 + lVar29)) *
                                           dVar58) * local_340 +
                                 ((local_500.p[lVar19 + lVar26 + lVar32] -
                                  local_500.p[lVar19 + lVar26 + (iVar11 + iVar16)]) * dVar57 +
                                 (local_500.p[lVar20 + lVar26 + lVar54] -
                                 local_500.p[lVar20 + lVar26 + (iVar23 + iVar16)]) * dVar59) *
                                 local_348;
                        dVar3 = local_200.p
                                [lVar17 + (((local_680 - local_200.begin.y) * local_200.jstride +
                                           (lVar27 - local_200.begin.z) * local_200.kstride + lVar44
                                           ) - (long)local_200.begin.x)];
                        dVar61 = local_2c0.p
                                 [lVar17 + ((local_2c0.nstride + lVar35 + lVar36 + lVar44) -
                                           (long)local_2c0.begin.x)];
                        dVar62 = local_2c0.p
                                 [lVar17 + ((lVar35 + lVar36 + lVar44) - (long)local_2c0.begin.x)];
                        local_3e8.p[lVar17 + ((lVar43 + lVar30 + lVar44) - lVar46)] =
                             ((local_500.p[lVar19 + lVar26 + lVar32 + local_500.nstride] -
                              (local_500.p + lVar19 + lVar26 + (iVar11 + iVar16))[local_500.nstride]
                              ) * dVar57 +
                             (local_500.p[lVar20 + lVar26 + lVar54 + local_500.nstride] -
                             (local_500.p + lVar20 + lVar26 + (iVar23 + iVar16))[local_500.nstride])
                             * dVar59) * local_348 * -dVar62;
                        local_3e8.p
                        [lVar17 + ((local_3e8.nstride + lVar43 + lVar30 + lVar44) - lVar46)] =
                             dVar66 * -0.6666666666666666 * (dVar61 - dVar3) * -0.75 -
                             dVar66 * dVar3;
                        local_3e8.p
                        [lVar17 + ((lVar43 + lVar30 + local_3e8.nstride * 2 + lVar44) - lVar46)] =
                             -dVar62 * ((dVar64 - dVar2) * dVar60 + (dVar63 - dVar65) * dVar58) *
                                       local_340;
                      }
                      else {
                        local_3e8.p[lVar17 + ((lVar43 + lVar30 + lVar44) - lVar46)] = 0.0;
                        local_3e8.p
                        [lVar17 + ((local_3e8.nstride + lVar43 + lVar30 + lVar44) - lVar46)] = 0.0;
                        local_3e8.p
                        [lVar17 + ((lVar43 + lVar30 + local_3e8.nstride * 2 + lVar44) - lVar46)] =
                             0.0;
                      }
                      lVar44 = lVar44 + 1;
                    } while ((local_538.bigend.vect[0] - local_538.smallend.vect[0]) + 1 !=
                             (int)lVar44);
                  }
                  local_680 = local_680 + 1;
                  local_638 = local_638 + 1;
                  lVar42 = lVar42 + local_e0.jstride * 8;
                } while (local_538.bigend.vect[1] + 1 != (int)local_680);
              }
              bVar56 = iVar10 != local_538.bigend.vect[2];
              iVar10 = iVar10 + 1;
            } while (bVar56);
          }
          if (local_554.smallend.vect[2] <= local_554.bigend.vect[2]) {
            lVar53 = (long)local_554.smallend.vect[0];
            lVar13 = lVar53 * 8;
            iVar10 = local_554.smallend.vect[2] + -1;
            iVar16 = local_554.smallend.vect[2];
            do {
              if (local_554.smallend.vect[1] <= local_554.bigend.vect[1]) {
                lVar27 = (long)iVar16;
                lVar42 = (long)local_120.p +
                         ((long)local_554.smallend.vect[1] - (long)local_120.begin.y) *
                         local_120.jstride * 8 +
                         (lVar27 - local_120.begin.z) * local_120.kstride * 8 +
                         (long)local_120.begin.x * -8 + lVar13;
                lVar17 = (long)local_554.smallend.vect[1];
                do {
                  if (local_554.smallend.vect[0] <= local_554.bigend.vect[0]) {
                    lVar20 = (lVar17 - local_500.begin.y) * local_500.jstride;
                    lVar21 = (iVar16 - local_500.begin.z) * local_500.kstride;
                    lVar24 = ((iVar16 + -1) - local_500.begin.z) * local_500.kstride;
                    lVar43 = (long)local_428.begin.x;
                    lVar46 = (lVar17 - local_428.begin.y) * local_428.jstride;
                    lVar30 = (lVar27 - local_428.begin.z) * local_428.kstride;
                    lVar44 = (lVar17 - local_300.begin.y) * local_300.jstride;
                    lVar36 = (lVar27 - local_300.begin.z) * local_300.kstride;
                    lVar29 = (lVar27 - local_500.begin.z) * local_500.kstride * 8;
                    lVar51 = ((long)iVar10 - (long)local_500.begin.z) * local_500.kstride * 8;
                    lVar18 = (long)local_500.begin.x;
                    lVar45 = local_500.nstride * 0x10 + lVar29 + lVar18 * -8 + lVar13;
                    lVar29 = local_500.nstride * 8 + lVar29 + lVar18 * -8 + lVar13;
                    lVar15 = local_500.nstride * 0x10 + lVar51 + lVar18 * -8 + lVar13;
                    lVar19 = lVar51 + local_500.nstride * 8 + lVar18 * -8 + lVar13;
                    lVar26 = (lVar17 - local_3a8.begin.y) * local_3a8.jstride;
                    lVar51 = local_500.jstride * 8;
                    lVar18 = -(long)local_500.begin.y;
                    lVar35 = 0;
                    do {
                      dVar64 = 1.0;
                      dVar58 = *(double *)(lVar42 + lVar35 * 8);
                      if ((dVar58 != 0.0) || (NAN(dVar58))) {
                        uVar47 = *(uint32_t *)
                                  ((long)&local_3a8.p
                                          [lVar53 + ((lVar26 + lVar35) - (long)local_3a8.begin.x)].
                                          flag +
                                  (lVar27 - local_3a8.begin.z) * local_3a8.kstride * 4);
                        uVar28 = uVar47 >> 0x13 & 1;
                        iVar23 = (int)(uVar47 << 0xe) >> 0x1f;
                        iVar11 = uVar28 - iVar23;
                        dVar58 = 1.0;
                        if (iVar11 != 1) {
                          dVar58 = 0.0;
                        }
                        dVar57 = 0.5;
                        if (iVar11 != 2) {
                          dVar57 = dVar58;
                        }
                        uVar4 = *(uint32_t *)
                                 ((long)&local_3a8.p
                                         [lVar53 + ((lVar26 + lVar35) - (long)local_3a8.begin.x)].
                                         flag +
                                 ((long)iVar10 - (long)local_3a8.begin.z) * local_3a8.kstride * 4);
                        uVar52 = uVar4 >> 0x13 & 1;
                        iVar50 = (int)(uVar4 << 0xe) >> 0x1f;
                        iVar11 = uVar52 - iVar50;
                        dVar58 = 1.0;
                        if (iVar11 != 1) {
                          dVar58 = 0.0;
                        }
                        dVar59 = 0.5;
                        if (iVar11 != 2) {
                          dVar59 = dVar58;
                        }
                        uVar12 = uVar47 >> 0x15 & 1;
                        iVar38 = (int)(short)uVar47 >> 0xf;
                        iVar11 = uVar12 - iVar38;
                        dVar58 = 1.0;
                        if (iVar11 != 1) {
                          dVar58 = 0.0;
                        }
                        dVar60 = 0.5;
                        if (iVar11 != 2) {
                          dVar60 = dVar58;
                        }
                        uVar47 = uVar4 >> 0x15 & 1;
                        iVar11 = (int)(short)uVar4 >> 0xf;
                        iVar40 = uVar47 - iVar11;
                        if (iVar40 != 1) {
                          dVar64 = 0.0;
                        }
                        dVar58 = 0.5;
                        if (iVar40 != 2) {
                          dVar58 = dVar64;
                        }
                        iVar41 = (local_554.smallend.vect[0] - local_500.begin.x) + (int)lVar35;
                        lVar32 = (long)(int)(uVar28 + iVar41);
                        lVar33 = (long)(int)(uVar52 + iVar41);
                        iVar40 = (int)lVar17;
                        lVar54 = ((int)(uVar12 + iVar40) + lVar18) * lVar51;
                        lVar34 = ((iVar38 + iVar40) + lVar18) * lVar51;
                        lVar39 = ((int)(uVar47 + iVar40) + lVar18) * lVar51;
                        lVar22 = ((iVar11 + iVar40) + lVar18) * lVar51;
                        dVar64 = *(double *)((long)local_500.p + lVar35 * 8 + lVar54 + lVar45);
                        dVar2 = *(double *)((long)local_500.p + lVar35 * 8 + lVar34 + lVar45);
                        dVar63 = *(double *)((long)local_500.p + lVar35 * 8 + lVar39 + lVar15);
                        dVar65 = *(double *)((long)local_500.p + lVar35 * 8 + lVar22 + lVar15);
                        dVar66 = ((*(double *)((long)local_500.p + lVar35 * 8 + lVar54 + lVar29) -
                                  *(double *)((long)local_500.p + lVar35 * 8 + lVar34 + lVar29)) *
                                  dVar60 + (*(double *)
                                             ((long)local_500.p + lVar35 * 8 + lVar39 + lVar19) -
                                           *(double *)
                                            ((long)local_500.p + lVar35 * 8 + lVar22 + lVar19)) *
                                           dVar58) * local_338 +
                                 ((local_500.p[lVar20 + lVar21 + lVar32] -
                                  local_500.p[lVar20 + lVar21 + (iVar23 + iVar41)]) * dVar57 +
                                 (local_500.p[lVar20 + lVar24 + lVar33] -
                                 local_500.p[lVar20 + lVar24 + (iVar50 + iVar41)]) * dVar59) *
                                 local_348;
                        dVar3 = local_240.p
                                [lVar53 + (((lVar17 - local_240.begin.y) * local_240.jstride +
                                           (lVar27 - local_240.begin.z) * local_240.kstride + lVar35
                                           ) - (long)local_240.begin.x)];
                        dVar61 = local_300.p
                                 [lVar53 + ((lVar44 + lVar36 + local_300.nstride * 2 + lVar35) -
                                           (long)local_300.begin.x)];
                        dVar62 = local_300.p
                                 [lVar53 + ((lVar44 + lVar36 + lVar35) - (long)local_300.begin.x)];
                        local_428.p[lVar53 + ((lVar46 + lVar30 + lVar35) - lVar43)] =
                             ((local_500.p[lVar20 + lVar21 + lVar32 + local_500.nstride * 2] -
                              (local_500.p + lVar20 + lVar21 + (iVar23 + iVar41))
                              [local_500.nstride * 2]) * dVar57 +
                             (local_500.p[lVar20 + lVar24 + lVar33 + local_500.nstride * 2] -
                             (local_500.p + lVar20 + lVar24 + (iVar50 + iVar41))
                             [local_500.nstride * 2]) * dVar59) * local_348 * -dVar62;
                        local_428.p
                        [lVar53 + ((local_428.nstride + lVar46 + lVar30 + lVar35) - lVar43)] =
                             -dVar62 * ((dVar64 - dVar2) * dVar60 + (dVar63 - dVar65) * dVar58) *
                                       local_338;
                        local_428.p
                        [lVar53 + ((lVar46 + lVar30 + local_428.nstride * 2 + lVar35) - lVar43)] =
                             dVar66 * -0.6666666666666666 * (dVar61 - dVar3) * -0.75 -
                             dVar66 * dVar3;
                      }
                      else {
                        local_428.p[lVar53 + ((lVar46 + lVar30 + lVar35) - lVar43)] = 0.0;
                        local_428.p
                        [lVar53 + ((local_428.nstride + lVar46 + lVar30 + lVar35) - lVar43)] = 0.0;
                        local_428.p
                        [lVar53 + ((lVar46 + lVar30 + local_428.nstride * 2 + lVar35) - lVar43)] =
                             0.0;
                      }
                      lVar35 = lVar35 + 1;
                    } while ((local_554.bigend.vect[0] - local_554.smallend.vect[0]) + 1 !=
                             (int)lVar35);
                  }
                  lVar17 = lVar17 + 1;
                  lVar42 = lVar42 + local_120.jstride * 8;
                } while (local_554.bigend.vect[1] + 1 != (int)lVar17);
              }
              iVar10 = iVar10 + 1;
              bVar56 = iVar16 != local_554.bigend.vect[2];
              iVar16 = iVar16 + 1;
            } while (bVar56);
          }
        }
      }
      MFIter::operator++((MFIter *)&local_180);
      lVar13 = local_308;
      pFVar48 = local_310;
    } while (local_160[0] < local_158);
  }
  this_00 = (Geometry *)(lVar13 + local_350);
  MFIter::~MFIter((MFIter *)&local_180);
  lVar13 = 0;
  do {
    local_180.vect = (int  [3])Geometry::periodicity(this_00);
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              ((FabArray<amrex::FArrayBox> *)
               ((long)&(pFVar48->super_FabArrayBase)._vptr_FabArrayBase + lVar13),0,3,
               (Periodicity *)&local_180,false);
    lVar13 = lVar13 + 0x180;
  } while (lVar13 != 0x480);
  return;
}

Assistant:

void
MLEBTensorOp::compCrossTerms(int amrlev, int mglev, MultiFab const& mf) const
{
    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][mglev].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
    auto area = (factory) ? factory->getAreaFrac()
        : Array<const MultiCutFab*,AMREX_SPACEDIM>{AMREX_D_DECL(nullptr,nullptr,nullptr)};

    const Geometry& geom = m_geom[amrlev][mglev];
    const auto dxinv = geom.InvCellSizeArray();

    Array<MultiFab,AMREX_SPACEDIM> const& etamf = m_b_coeffs[amrlev][mglev];
    Array<MultiFab,AMREX_SPACEDIM> const& kapmf = m_kappa[amrlev][mglev];
    Array<MultiFab,AMREX_SPACEDIM>& fluxmf = m_tauflux[amrlev][mglev];

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        AMREX_D_TERM(Box const xbx = mfi.nodaltilebox(0);,
                     Box const ybx = mfi.nodaltilebox(1);,
                     Box const zbx = mfi.nodaltilebox(2););

        // grow by 1 because of corners
        auto fabtyp = (flags) ? (*flags)[mfi].getType(amrex::grow(bx,1)) : FabType::regular;

        if (fabtyp == FabType::covered) {
          AMREX_D_TERM(Array4<Real> const& fxfab = fluxmf[0].array(mfi);,
                       Array4<Real> const& fyfab = fluxmf[1].array(mfi);,
                       Array4<Real> const& fzfab = fluxmf[2].array(mfi););
          AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM
          ( xbx, txbx,
            {
                AMREX_LOOP_4D(txbx, AMREX_SPACEDIM, i, j, k, n,
                {
                    fxfab(i,j,k,n) = 0.0;
                });
            }
            , ybx, tybx,
            {
                AMREX_LOOP_4D(tybx, AMREX_SPACEDIM, i, j, k, n,
                {
                    fyfab(i,j,k,n) = 0.0;
                });
            }
            , zbx, tzbx,
            {
                AMREX_LOOP_4D(tzbx, AMREX_SPACEDIM, i, j, k, n,
                {
                    fzfab(i,j,k,n) = 0.0;
                });
            }
          );
        } else {
          AMREX_D_TERM(Array4<Real> const fxfab = fluxmf[0].array(mfi);,
                       Array4<Real> const fyfab = fluxmf[1].array(mfi);,
                       Array4<Real> const fzfab = fluxmf[2].array(mfi););
          Array4<Real const> const vfab = mf.const_array(mfi);
          AMREX_D_TERM(Array4<Real const> const etaxfab = etamf[0].const_array(mfi);,
                       Array4<Real const> const etayfab = etamf[1].const_array(mfi);,
                       Array4<Real const> const etazfab = etamf[2].const_array(mfi););
          AMREX_D_TERM(Array4<Real const> const kapxfab = kapmf[0].const_array(mfi);,
                       Array4<Real const> const kapyfab = kapmf[1].const_array(mfi);,
                       Array4<Real const> const kapzfab = kapmf[2].const_array(mfi););

          if (fabtyp == FabType::regular)
          {
              AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM
              ( xbx, txbx,
                {
                  mltensor_cross_terms_fx(txbx,fxfab,vfab,etaxfab,kapxfab,dxinv);
                }
                , ybx, tybx,
                {
                  mltensor_cross_terms_fy(tybx,fyfab,vfab,etayfab,kapyfab,dxinv);
                }
                , zbx, tzbx,
                {
                  mltensor_cross_terms_fz(tzbx,fzfab,vfab,etazfab,kapzfab,dxinv);
                }
              );
          }
          else
          {
            AMREX_D_TERM(Array4<Real const> const& apx = area[0]->const_array(mfi);,
                         Array4<Real const> const& apy = area[1]->const_array(mfi);,
                         Array4<Real const> const& apz = area[2]->const_array(mfi););
            Array4<EBCellFlag const> const& flag = flags->const_array(mfi);

            AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM
            ( xbx, txbx,
              {
                mlebtensor_cross_terms_fx(txbx,fxfab,vfab,etaxfab,kapxfab,apx,flag,dxinv);
              }
              , ybx, tybx,
              {
                mlebtensor_cross_terms_fy(tybx,fyfab,vfab,etayfab,kapyfab,apy,flag,dxinv);
              }
              , zbx, tzbx,
              {
                mlebtensor_cross_terms_fz(tzbx,fzfab,vfab,etazfab,kapzfab,apz,flag,dxinv);
              }
              );
          }
        }
    }

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        fluxmf[idim].FillBoundary(0, AMREX_SPACEDIM, geom.periodicity());
    }
}